

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.hpp
# Opt level: O1

SPIRFunction * __thiscall
diligent_spirv_cross::Parser::set<diligent_spirv_cross::SPIRFunction,unsigned_int&,unsigned_int&>
          (Parser *this,uint32_t id,uint *args,uint *args_1)

{
  Variant *this_00;
  SPIRFunction *val;
  
  ParsedIR::add_typed_id(&this->ir,TypeFunction,(ID)id);
  this_00 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + id;
  val = ObjectPool<diligent_spirv_cross::SPIRFunction>::allocate<unsigned_int&,unsigned_int&>
                  ((ObjectPool<diligent_spirv_cross::SPIRFunction> *)
                   this_00->group->pools[4]._M_t.
                   super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                   .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false>.
                   _M_head_impl,args,args_1);
  Variant::set(this_00,&val->super_IVariant,TypeFunction);
  (val->super_IVariant).self.id = id;
  return val;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		return var;
	}